

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O0

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::WriteNull(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
            *this)

{
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  *this_local;
  
  PutReserve<rapidjson::UTF8<char>,rapidjson::CrtAllocator>(this->os_,4);
  PutUnsafe<rapidjson::UTF8<char>,rapidjson::CrtAllocator>(this->os_,'n');
  PutUnsafe<rapidjson::UTF8<char>,rapidjson::CrtAllocator>(this->os_,'u');
  PutUnsafe<rapidjson::UTF8<char>,rapidjson::CrtAllocator>(this->os_,'l');
  PutUnsafe<rapidjson::UTF8<char>,rapidjson::CrtAllocator>(this->os_,'l');
  return true;
}

Assistant:

bool WriteNull()  {
        PutReserve(*os_, 4);
        PutUnsafe(*os_, 'n'); PutUnsafe(*os_, 'u'); PutUnsafe(*os_, 'l'); PutUnsafe(*os_, 'l'); return true;
    }